

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# period.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  datetime *pdVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  undefined1 local_460 [8];
  datetime d;
  iterator __end1;
  iterator __begin1;
  accessor<3600UL> local_2c0;
  accessor<3600UL> *local_2b0;
  accessor<3600UL> *__range1;
  iterator local_270;
  undefined1 local_1c0 [8];
  iterator i;
  undefined1 local_108 [8];
  accessor<3600UL> everyhour;
  datetime local_c0;
  undefined1 local_88 [8];
  period period;
  char **argv_local;
  int argc_local;
  
  period.end_.when.tm_zone = (char *)argv;
  setlocale(6,"");
  asap::now();
  asap::tomorrow();
  asap::datetime::until((period *)local_88,&local_c0,(datetime *)&everyhour.step);
  asap::duration<3600UL>::duration(&i.step,1.0);
  _local_108 = asap::period::every<3600ul>((period *)local_88,&i.step);
  poVar2 = std::operator<<((ostream *)&std::cout,"every hour until tomorrow:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  asap::detail::accessor<3600UL>::begin((iterator *)local_1c0,(accessor<3600UL> *)local_108);
  while( true ) {
    asap::detail::accessor<3600UL>::end(&local_270,(accessor<3600UL> *)local_108);
    bVar1 = asap::detail::accessor<3600UL>::iterator::operator!=((iterator *)local_1c0,&local_270);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"* ");
    pdVar3 = asap::detail::accessor<3600UL>::iterator::operator*((iterator *)local_1c0);
    pbVar4 = asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar2,pdVar3);
    std::ostream::operator<<((ostream *)pbVar4,std::endl<char,std::char_traits<char>>);
    asap::detail::accessor<3600UL>::iterator::operator++
              ((datetime *)&__range1,(iterator *)local_1c0,0);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"every 3 hours until tomorrow:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  asap::duration<3600UL>::duration(&__begin1.step,3.0);
  local_2c0 = asap::period::every<3600ul>((period *)local_88,&__begin1.step);
  local_2b0 = &local_2c0;
  asap::detail::accessor<3600UL>::begin((iterator *)&__end1.step,local_2b0);
  asap::detail::accessor<3600UL>::end((iterator *)&d.when.tm_zone,local_2b0);
  while( true ) {
    bVar1 = asap::detail::accessor<3600UL>::iterator::operator!=
                      ((iterator *)&__end1.step,(iterator *)&d.when.tm_zone);
    if (!bVar1) break;
    pdVar3 = asap::detail::accessor<3600UL>::iterator::operator*((iterator *)&__end1.step);
    memcpy(local_460,pdVar3,0x38);
    poVar2 = std::operator<<((ostream *)&std::cout,"* ");
    pbVar4 = asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar2,
                              (datetime *)local_460);
    std::ostream::operator<<((ostream *)pbVar4,std::endl<char,std::char_traits<char>>);
    asap::detail::accessor<3600UL>::iterator::operator++((iterator *)&__end1.step);
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  /* Setting locale helps with local time format. It is not required. */
  setlocale(LC_ALL, "");

  /* Creates a period, from now until tomorrow. */
  auto period = asap::now().until(asap::tomorrow());

  /* Iterates from now until tomorrow, by every hour, using oldschool iterators.
   * Be aware that tomorrow happens to be next day *exactly* at midnight, which means
   * unless asap::now() is exactly at 0 minutes and 0 seconds, the next day will
   * never be printed. */
  auto everyhour = period.every(asap::hours(1));
  std::cout << "every hour until tomorrow:" << std::endl;
  for (auto i = everyhour.begin(); i != everyhour.end(); i++) {
    std::cout << "* " << *i << std::endl;
  }
  std::cout << std::endl;

  /* you can also use the newschool for :) */
  std::cout << "every 3 hours until tomorrow:" << std::endl;
  for (auto d: period.every(asap::hour(3))) {
    std::cout << "* " << d << std::endl;
  }

  return 0;
}